

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_cab.c
# Opt level: O0

wchar_t archive_read_format_cab_read_data(archive_read *a,void **buff,size_t *size,int64_t *offset)

{
  int64_t *piVar1;
  wchar_t wVar2;
  int64_t iVar3;
  wchar_t r;
  cab *cab;
  int64_t *offset_local;
  size_t *size_local;
  void **buff_local;
  archive_read *a_local;
  
  piVar1 = (int64_t *)a->format->data;
  if (*(ushort *)(piVar1[6] + 0x10) - 0xfffd < 3) {
    *buff = (void *)0x0;
    *size = 0;
    *offset = 0;
    archive_clear_error(&a->archive);
    archive_set_error(&a->archive,0x54,"Cannot restore this file split in multivolume.");
    return L'\xffffffe7';
  }
  if (*(char *)((long)piVar1 + 0x94) == '\0') {
    if (piVar1[0x13] != 0) {
      if ((piVar1[7] == 0) && (wVar2 = cab_next_cfdata(a), wVar2 < L'\0')) {
        return wVar2;
      }
      iVar3 = cab_consume_cfdata(a,piVar1[0x13]);
      if (iVar3 < 0) {
        return L'\xffffffe2';
      }
      piVar1[0x13] = 0;
    }
    *(undefined1 *)((long)piVar1 + 0x94) = 1;
  }
  if (piVar1[2] != 0) {
    iVar3 = cab_consume_cfdata(a,piVar1[2]);
    piVar1[2] = 0;
    if ((wchar_t)iVar3 < L'\0') {
      return (wchar_t)iVar3;
    }
  }
  if ((*(char *)((long)piVar1 + 0x91) == '\0') && (*(char *)((long)piVar1 + 0x92) == '\0')) {
    a_local._4_4_ = cab_read_data(a,buff,size,offset);
  }
  else {
    if (*(char *)((long)piVar1 + 0x93) == '\0') {
      *(undefined1 *)((long)piVar1 + 0x93) = 1;
    }
    *offset = *piVar1;
    *size = 0;
    *buff = (void *)0x0;
    a_local._4_4_ = L'\x01';
  }
  return a_local._4_4_;
}

Assistant:

static int
archive_read_format_cab_read_data(struct archive_read *a,
    const void **buff, size_t *size, int64_t *offset)
{
	struct cab *cab = (struct cab *)(a->format->data);
	int r;

	switch (cab->entry_cffile->folder) {
	case iFoldCONTINUED_FROM_PREV:
	case iFoldCONTINUED_TO_NEXT:
	case iFoldCONTINUED_PREV_AND_NEXT:
		*buff = NULL;
		*size = 0;
		*offset = 0;
		archive_clear_error(&a->archive);
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "Cannot restore this file split in multivolume.");
		return (ARCHIVE_FAILED);
	default:
		break;
	}
	if (cab->read_data_invoked == 0) {
		if (cab->bytes_skipped) {
			if (cab->entry_cfdata == NULL) {
				r = cab_next_cfdata(a);
				if (r < 0)
					return (r);
			}
			if (cab_consume_cfdata(a, cab->bytes_skipped) < 0)
				return (ARCHIVE_FATAL);
			cab->bytes_skipped = 0;
		}
		cab->read_data_invoked = 1;
	}
	if (cab->entry_unconsumed) {
		/* Consume as much as the compressor actually used. */
		r = (int)cab_consume_cfdata(a, cab->entry_unconsumed);
		cab->entry_unconsumed = 0;
		if (r < 0)
			return (r);
	}
	if (cab->end_of_archive || cab->end_of_entry) {
		if (!cab->end_of_entry_cleanup) {
			/* End-of-entry cleanup done. */
			cab->end_of_entry_cleanup = 1;
		}
		*offset = cab->entry_offset;
		*size = 0;
		*buff = NULL;
		return (ARCHIVE_EOF);
	}

	return (cab_read_data(a, buff, size, offset));
}